

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_compile(HSQUIRRELVM v,SQLEXREADFUNC read,SQUserPointer p,SQChar *sourcename,
                   SQBool raiseerror)

{
  SQUnsignedInteger *pSVar1;
  SQSharedState *ss;
  SQObjectValue func;
  bool bVar2;
  SQWeakRef *root;
  SQRESULT SVar3;
  SQObjectPtr o;
  SQObjectPtr local_38;
  SQObjectPtr local_28;
  
  local_38.super_SQObject._type = OT_NULL;
  local_38.super_SQObject._unVal.pTable = (SQTable *)0x0;
  bVar2 = Compile(v,read,p,sourcename,&local_38,raiseerror != 0,v->_sharedstate->_debuginfo);
  func = local_38.super_SQObject._unVal;
  SVar3 = -1;
  if (bVar2) {
    ss = v->_sharedstate;
    root = SQRefCounted::GetWeakRef((v->_roottable).super_SQObject._unVal.pRefCounted,OT_TABLE);
    local_28.super_SQObject._unVal.pClosure = SQClosure::Create(ss,func.pFunctionProto,root);
    local_28.super_SQObject._type = OT_CLOSURE;
    pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQVM::Push(v,&local_28);
    SQObjectPtr::~SQObjectPtr(&local_28);
    SVar3 = 0;
  }
  SQObjectPtr::~SQObjectPtr(&local_38);
  return SVar3;
}

Assistant:

SQRESULT sq_compile(HSQUIRRELVM v,SQLEXREADFUNC read,SQUserPointer p,const SQChar *sourcename,SQBool raiseerror)
{
    SQObjectPtr o;
#ifndef NO_COMPILER
    if(Compile(v, read, p, sourcename, o, raiseerror?true:false, _ss(v)->_debuginfo)) {
        v->Push(SQClosure::Create(_ss(v), _funcproto(o), _table(v->_roottable)->GetWeakRef(OT_TABLE)));
        return SQ_OK;
    }
    return SQ_ERROR;
#else
    return sq_throwerror(v,_SC("this is a no compiler build"));
#endif
}